

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::RegexMatchAll
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  const_reference pvVar2;
  char *pcVar3;
  Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *r_00;
  size_type sVar4;
  ulong uVar5;
  allocator local_271;
  string local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [8];
  string e_1;
  size_type r;
  size_type l;
  char *p;
  string output;
  Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1b8;
  undefined1 local_1a8 [8];
  string input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string e;
  RegularExpression re;
  undefined1 local_60 [8];
  string outvar;
  string regex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,2);
  std::__cxx11::string::string((string *)(outvar.field_2._M_local_buf + 8),(string *)pvVar2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,3);
  std::__cxx11::string::string((string *)local_60,(string *)pvVar2);
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  cmsys::RegularExpression::RegularExpression((RegularExpression *)((long)&e.field_2 + 8));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::RegularExpression::compile((RegularExpression *)((long)&e.field_2 + 8),pcVar3);
  if (bVar1) {
    local_1b8 = cmRange<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (args);
    r_00 = ContainerAlgorithms::
           Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::advance(&local_1b8,4);
    std::__cxx11::string::string((string *)(output.field_2._M_local_buf + 8));
    cmJoin<ContainerAlgorithms::Range<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((string *)local_1a8,r_00,(string *)(output.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&p);
    l = std::__cxx11::string::c_str();
    while( true ) {
      bVar1 = cmsys::RegularExpression::find((RegularExpression *)((long)&e.field_2 + 8),(char *)l);
      if (!bVar1) break;
      cmMakefile::StoreMatches
                ((this->super_cmCommand).Makefile,(RegularExpression *)((long)&e.field_2 + 8));
      sVar4 = cmsys::RegularExpression::start((RegularExpression *)((long)&e.field_2 + 8));
      e_1.field_2._8_8_ = cmsys::RegularExpression::end((RegularExpression *)((long)&e.field_2 + 8))
      ;
      if (e_1.field_2._8_8_ == sVar4) {
        std::operator+(&local_250,"sub-command REGEX, mode MATCHALL regex \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&outvar.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_230,&local_250,"\" matched an empty string.");
        std::__cxx11::string::~string((string *)&local_250);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_230);
        this_local._7_1_ = false;
        input.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_230);
        goto LAB_0052c70f;
      }
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)&p,";");
      }
      uVar5 = e_1.field_2._8_8_ - sVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_270,(char *)(l + sVar4),uVar5,&local_271);
      std::__cxx11::string::operator+=((string *)&p,local_270);
      std::__cxx11::string::~string(local_270);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
      l = e_1.field_2._8_8_ + l;
    }
    this_00 = (this->super_cmCommand).Makefile;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(this_00,(string *)local_60,pcVar3);
    this_local._7_1_ = true;
    input.field_2._12_4_ = 1;
LAB_0052c70f:
    std::__cxx11::string::~string((string *)&p);
    std::__cxx11::string::~string((string *)local_1a8);
  }
  else {
    std::operator+(&local_180,"sub-command REGEX, mode MATCHALL failed to compile regex \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&outvar.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                   &local_180,"\".");
    std::__cxx11::string::~string((string *)&local_180);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_160);
    this_local._7_1_ = false;
    input.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_160);
  }
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)((long)&e.field_2 + 8));
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(outvar.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool cmStringCommand::RegexMatchAll(std::vector<std::string> const& args)
{
  //"STRING(REGEX MATCHALL <regular_expression> <output variable> <input>
  // [<input>...])\n";
  std::string regex = args[2];
  std::string outvar = args[3];

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if(!re.compile(regex.c_str()))
    {
    std::string e =
      "sub-command REGEX, mode MATCHALL failed to compile regex \""+
      regex+"\".";
    this->SetError(e);
    return false;
    }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  const char* p = input.c_str();
  while(re.find(p))
    {
    this->Makefile->StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if(r-l == 0)
      {
      std::string e = "sub-command REGEX, mode MATCHALL regex \""+
        regex+"\" matched an empty string.";
      this->SetError(e);
      return false;
      }
    if(!output.empty())
      {
      output += ";";
      }
    output += std::string(p+l, r-l);
    p += r;
    }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}